

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O0

int EncodeFrame(WebPConfig *config,WebPPicture *pic,WebPMemoryWriter *memory)

{
  int iVar1;
  undefined8 in_RDX;
  undefined4 *in_RSI;
  WebPPicture *unaff_retaddr;
  uint local_4;
  
  *in_RSI = 1;
  *(code **)(in_RSI + 0x18) = WebPMemoryWrite;
  *(undefined8 *)(in_RSI + 0x1a) = in_RDX;
  iVar1 = WebPEncode((WebPConfig *)memory,unaff_retaddr);
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

static int EncodeFrame(const WebPConfig* const config, WebPPicture* const pic,
                       WebPMemoryWriter* const memory) {
  pic->use_argb = 1;
  pic->writer = WebPMemoryWrite;
  pic->custom_ptr = memory;
  if (!WebPEncode(config, pic)) {
    return 0;
  }
  return 1;
}